

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  ParamDictPrivate *pPVar1;
  int *piVar2;
  void *__ptr;
  long *plVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    pPVar1 = this->d;
    *(undefined4 *)((long)&pPVar1->params[0].type + lVar4) = 0;
    piVar2 = *(int **)((long)&pPVar1->params[0].v.refcount + lVar4);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        __ptr = *(void **)((long)&pPVar1->params[0].v.data + lVar4);
        plVar3 = *(long **)((long)&pPVar1->params[0].v.allocator + lVar4);
        if (plVar3 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&pPVar1->params[0].v.cstep + lVar4) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.elemsize + lVar4 + 4) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.refcount + lVar4) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.w + lVar4) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.d + lVar4) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.dims + lVar4) = 0;
    lVar4 = lVar4 + 0x50;
  } while (lVar4 != 0xa00);
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        d->params[i].type = 0;
        d->params[i].v = Mat();
    }
}